

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O0

void __thiscall
re2c::Skeleton::generate_paths_cunit<unsigned_int>(Skeleton *this,FILE *input,FILE *keys)

{
  size_t sVar1;
  FILE *keys_local;
  FILE *input_local;
  Skeleton *this_local;
  
  sVar1 = this->sizeof_key;
  if (sVar1 == 1) {
    generate_paths_cunit_key<unsigned_int,unsigned_char>(this,input,keys);
  }
  else if (sVar1 == 2) {
    generate_paths_cunit_key<unsigned_int,unsigned_short>(this,input,keys);
  }
  else if (sVar1 == 4) {
    generate_paths_cunit_key<unsigned_int,unsigned_int>(this,input,keys);
  }
  return;
}

Assistant:

void Skeleton::generate_paths_cunit (FILE * input, FILE * keys)
{
	switch (sizeof_key)
	{
		case 4: generate_paths_cunit_key<cunit_t, uint32_t> (input, keys); break;
		case 2: generate_paths_cunit_key<cunit_t, uint16_t> (input, keys); break;
		case 1: generate_paths_cunit_key<cunit_t, uint8_t> (input, keys);  break;
	}
}